

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

void __thiscall slang::JsonWriter::startArray(JsonWriter *this)

{
  string_view fmt;
  format_args args;
  char *local_28 [2];
  int local_18;
  
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"[","");
  if (this->pretty == true) {
    local_18 = this->currentIndent + this->indentSize;
    this->currentIndent = local_18;
    local_28[0] = "";
    fmt.size_ = 6;
    fmt.data_ = "\n{:{}}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_28;
    args.desc_ = 0x1c;
    ::fmt::v11::detail::vformat_to
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
  }
  return;
}

Assistant:

void JsonWriter::startArray() {
    buffer->append("[");
    if (pretty) {
        currentIndent += indentSize;
        buffer->format("\n{:{}}", "", currentIndent);
    }
}